

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cc-cubic.c
# Opt level: O0

void cubic_on_lost(quicly_cc_t *cc,quicly_loss_t *loss,uint32_t bytes,uint64_t lost_pn,
                  uint64_t next_pn,int64_t now,uint32_t max_udp_payload_size)

{
  ulong in_RCX;
  long in_RDI;
  undefined8 in_R8;
  quicly_cc_t *in_R9;
  uint32_t in_stack_ffffffffffffffcc;
  
  if (*(ulong *)(in_RDI + 0x10) <= in_RCX) {
    *(undefined8 *)(in_RDI + 0x10) = in_R8;
    *(int *)(in_RDI + 0x48) = *(int *)(in_RDI + 0x48) + 1;
    if (*(int *)(in_RDI + 0x3c) == 0) {
      *(undefined4 *)(in_RDI + 0x3c) = *(undefined4 *)(in_RDI + 8);
    }
    *(quicly_cc_t **)(in_RDI + 0x28) = in_R9;
    *(undefined4 *)(in_RDI + 0x20) = *(undefined4 *)(in_RDI + 8);
    if (*(uint *)(in_RDI + 0x20) < *(uint *)(in_RDI + 0x24)) {
      *(undefined4 *)(in_RDI + 0x24) = *(undefined4 *)(in_RDI + 0x20);
      *(int *)(in_RDI + 0x20) = (int)(long)((double)*(uint *)(in_RDI + 0x20) * 0.85);
    }
    else {
      *(undefined4 *)(in_RDI + 0x24) = *(undefined4 *)(in_RDI + 0x20);
    }
    update_cubic_k(in_R9,in_stack_ffffffffffffffcc);
    *(int *)(in_RDI + 8) = (int)(long)((double)*(uint *)(in_RDI + 8) * 0.7);
    if (*(uint *)(in_RDI + 8) < (uint)((int)now << 1)) {
      *(int *)(in_RDI + 8) = (int)now << 1;
    }
    *(undefined4 *)(in_RDI + 0xc) = *(undefined4 *)(in_RDI + 8);
    if (*(uint *)(in_RDI + 8) < *(uint *)(in_RDI + 0x40)) {
      *(undefined4 *)(in_RDI + 0x40) = *(undefined4 *)(in_RDI + 8);
    }
  }
  return;
}

Assistant:

static void cubic_on_lost(quicly_cc_t *cc, const quicly_loss_t *loss, uint32_t bytes, uint64_t lost_pn, uint64_t next_pn,
                          int64_t now, uint32_t max_udp_payload_size)
{
    /* Nothing to do if loss is in recovery window. */
    if (lost_pn < cc->recovery_end)
        return;
    cc->recovery_end = next_pn;

    ++cc->num_loss_episodes;
    if (cc->cwnd_exiting_slow_start == 0)
        cc->cwnd_exiting_slow_start = cc->cwnd;

    cc->state.cubic.avoidance_start = now;
    cc->state.cubic.w_max = cc->cwnd;

    /* RFC 8312, Section 4.6; Fast Convergence */
    /* w_last_max is initialized to zero; therefore this condition is false when exiting slow start */
    if (cc->state.cubic.w_max < cc->state.cubic.w_last_max) {
        cc->state.cubic.w_last_max = cc->state.cubic.w_max;
        cc->state.cubic.w_max *= (1.0 + QUICLY_CUBIC_BETA) / 2.0;
    } else {
        cc->state.cubic.w_last_max = cc->state.cubic.w_max;
    }
    update_cubic_k(cc, max_udp_payload_size);

    /* RFC 8312, Section 4.5; Multiplicative Decrease */
    cc->cwnd *= QUICLY_CUBIC_BETA;
    if (cc->cwnd < QUICLY_MIN_CWND * max_udp_payload_size)
        cc->cwnd = QUICLY_MIN_CWND * max_udp_payload_size;
    cc->ssthresh = cc->cwnd;

    if (cc->cwnd_minimum > cc->cwnd)
        cc->cwnd_minimum = cc->cwnd;
}